

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdObj_t * Kit_DsdNonDsdPrimeMax(Kit_DsdNtk_t *pNtk)

{
  Kit_DsdObj_t *pKVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  ulong uVar5;
  Kit_DsdObj_t *pKVar6;
  uint uVar7;
  
  uVar4 = 0;
  if ((ulong)pNtk->nNodes == 0) {
    return (Kit_DsdObj_t *)0x0;
  }
  uVar5 = 0;
  pKVar3 = (Kit_DsdObj_t *)0x0;
  do {
    pKVar1 = pNtk->pNodes[uVar5];
    if (pKVar1 == (Kit_DsdObj_t *)0x0) {
      return pKVar3;
    }
    uVar7 = (uint)*pKVar1 >> 0x1a;
    uVar2 = uVar7;
    if (uVar7 < uVar4) {
      uVar2 = uVar4;
    }
    pKVar6 = pKVar1;
    if (uVar7 <= uVar4) {
      pKVar6 = pKVar3;
    }
    if (((uint)*pKVar1 & 0x1c0) == 0x140) {
      uVar4 = uVar2;
      pKVar3 = pKVar6;
    }
    uVar5 = uVar5 + 1;
  } while (pNtk->nNodes != uVar5);
  return pKVar3;
}

Assistant:

Kit_DsdObj_t * Kit_DsdNonDsdPrimeMax( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj, * pObjMax = NULL;
    unsigned i, nSizeMax = 0;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        if ( nSizeMax < pObj->nFans )
        {
            nSizeMax = pObj->nFans;
            pObjMax = pObj;
        }
    }
    return pObjMax;
}